

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O2

void __thiscall
CcsTest_InterpolationIsDoneAtLoadTime_Test::TestBody
          (CcsTest_InterpolationIsDoneAtLoadTime_Test *this)

{
  string *psVar1;
  char *pcVar2;
  AssertHelper AStack_1d8;
  string local_1d0;
  AssertionResult gtest_ar;
  CcsDomain ccs;
  CcsContext ctx;
  istringstream input;
  
  ::ccs::CcsDomain::CcsDomain(&ccs,false);
  std::__cxx11::string::string((string *)&local_1d0,"a = \'foo${VAR1} baz\'",(allocator *)&ctx);
  std::__cxx11::istringstream::istringstream((istringstream *)&input,(string *)&local_1d0,_S_in);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_1d0,"<literal>",(allocator *)&ctx);
  ::ccs::CcsDomain::loadCcsStream
            (&ccs,(istream *)&input,&local_1d0,
             (ImportResolver *)&::ccs::(anonymous_namespace)::NoImportResolver);
  std::__cxx11::string::~string((string *)&local_1d0);
  ::ccs::CcsDomain::build((CcsDomain *)&ctx);
  std::__cxx11::string::string((string *)&local_1d0,"a",(allocator *)&AStack_1d8);
  psVar1 = ::ccs::CcsContext::getString(&ctx,&local_1d0);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"foo baz\"","ctx.getString(\"a\")",(char (*) [8])"foo baz",
             psVar1);
  std::__cxx11::string::~string((string *)&local_1d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1d0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xa8,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_1d8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1d8);
    if ((long *)local_1d0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1d0._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  setenv("VAR1","bar",1);
  std::__cxx11::string::string((string *)&local_1d0,"a",(allocator *)&AStack_1d8);
  psVar1 = ::ccs::CcsContext::getString(&ctx,&local_1d0);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"foo baz\"","ctx.getString(\"a\")",(char (*) [8])"foo baz",
             psVar1);
  std::__cxx11::string::~string((string *)&local_1d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1d0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xaa,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_1d8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1d8);
    if ((long *)local_1d0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1d0._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  unsetenv("VAR1");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ctx.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::istringstream::~istringstream((istringstream *)&input);
  ::ccs::CcsDomain::~CcsDomain(&ccs);
  return;
}

Assistant:

TEST(CcsTest, InterpolationIsDoneAtLoadTime) {
  CcsDomain ccs;
  std::istringstream input("a = 'foo${VAR1} baz'");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext ctx = ccs.build();
  EXPECT_EQ("foo baz", ctx.getString("a"));
  setenv("VAR1", "bar", true);
  EXPECT_EQ("foo baz", ctx.getString("a"));
  unsetenv("VAR1");
}